

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_error.cc
# Opt level: O3

void QL_PrintError(RC rc)

{
  size_t sVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  
  if (rc - 0x191U < 9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"QL warning: ",0xc);
    pcVar4 = QL_WarnMsg[rc - 0x191U];
    sVar1 = strlen(pcVar4);
  }
  else {
    if (rc == 0) {
      poVar5 = (ostream *)&std::cerr;
      pcVar4 = "QL_PrintError called with return code of 0\n";
      lVar3 = 0x2b;
      goto LAB_0011af8a;
    }
    if (rc == -0xb) {
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12b2f8);
      }
      else {
        sVar1 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar1);
      }
      poVar5 = (ostream *)&std::cerr;
      pcVar4 = "\n";
      lVar3 = 1;
      goto LAB_0011af8a;
    }
    if (rc != -0x191) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"QL error: ",10);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,rc);
      pcVar4 = " is out of bounds\n";
      lVar3 = 0x12;
      goto LAB_0011af8a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"QL error: ",10);
    pcVar4 = "Invalid database";
    sVar1 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar1);
  pcVar4 = "\n";
  lVar3 = 1;
  poVar5 = (ostream *)&std::cerr;
LAB_0011af8a:
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
  return;
}

Assistant:

void QL_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_QL_WARN && rc <= QL_LASTWARN)
    // Print warning
    cerr << "QL warning: " << QL_WarnMsg[rc - START_QL_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_QL_ERR && -rc < -QL_LASTERROR)
    // Print error
    cerr << "QL error: " << QL_ErrorMsg[-rc + START_QL_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "QL_PrintError called with return code of 0\n";
  else
    cerr << "QL error: " << rc << " is out of bounds\n";
}